

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O1

Test * GraphTestFunkyMakefilePath::Create(void)

{
  GraphTest *this;
  
  this = (GraphTest *)operator_new(0x230);
  GraphTest::GraphTest(this);
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__GraphTest_001fa5c0;
  g_current_test = (Test *)this;
  return (Test *)this;
}

Assistant:

TEST_F(GraphTest, FunkyMakefilePath) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule catdep\n"
"  depfile = $out.d\n"
"  command = cat $in > $out\n"
"build out.o: catdep foo.cc\n"));
  fs_.Create("foo.cc",  "");
  fs_.Create("out.o.d", "out.o: ./foo/../implicit.h\n");
  fs_.Create("out.o", "");
  fs_.Tick();
  fs_.Create("implicit.h", "");

  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("out.o"), NULL, &err));
  ASSERT_EQ("", err);

  // implicit.h has changed, though our depfile refers to it with a
  // non-canonical path; we should still find it.
  EXPECT_TRUE(GetNode("out.o")->dirty());
}